

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  char cVar2;
  byte bVar3;
  xml_encoding xVar4;
  size_t sVar5;
  long lVar6;
  xml_attribute_struct *pxVar7;
  xml_node_struct *pxVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  xml_parse_status xVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  undefined4 uVar16;
  ushort *puVar17;
  ushort *puVar18;
  byte *pbVar19;
  xml_node_struct **ppxVar20;
  xml_parse_status xVar21;
  size_t data_length;
  ulong uVar22;
  byte *pbVar23;
  ushort uVar24;
  long lVar25;
  byte *pbVar26;
  byte *pbVar27;
  type *data;
  byte *pbVar28;
  byte *pbVar29;
  void *pvVar30;
  bool bVar31;
  xml_node_struct *local_d0;
  xml_parser local_b8;
  ulong local_a0;
  xml_parse_result *local_98;
  byte *local_90;
  undefined4 local_84;
  byte *local_80;
  long local_78;
  xml_node_struct *local_70;
  uint local_64;
  xml_node_struct *local_60;
  code *local_58;
  byte *local_50;
  xml_node_struct **local_48;
  code *local_40;
  code *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    return __return_storage_ptr__;
  }
  local_70 = root;
  xVar4 = get_buffer_encoding(encoding,contents,size);
  local_a0 = (ulong)xVar4;
  pvVar30 = (void *)0x0;
  if (own) {
    pvVar30 = contents;
  }
  local_58 = (code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  if (xVar4 == encoding_utf8) {
    if (!is_mutable) {
      pbVar14 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(size + 1);
LAB_00123190:
      pbVar27 = (byte *)(size + 1);
      if (pbVar14 != (byte *)0x0) {
        if (contents != (void *)0x0) {
          memcpy(pbVar14,contents,size);
        }
        pbVar28 = pbVar14 + size;
        goto LAB_0012374c;
      }
      pbVar14 = (byte *)0x0;
      size = 0;
      bVar31 = false;
      goto LAB_00123758;
    }
LAB_00123099:
    bVar31 = true;
    pbVar14 = (byte *)contents;
  }
  else {
    if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
      uVar22 = size >> 1;
      pbVar27 = (byte *)0x1;
      if (xVar4 == encoding_utf16_le) {
        if (1 < size) {
          lVar6 = 0;
          uVar13 = uVar22;
          puVar17 = (ushort *)contents;
          do {
            uVar9 = *puVar17;
            if (uVar9 < 0xd800) {
              lVar25 = 3 - (ulong)(uVar9 < 0x800);
              if (uVar9 < 0x80) {
                lVar25 = 1;
              }
              lVar6 = lVar6 + lVar25;
LAB_00123120:
              lVar25 = -1;
              puVar18 = puVar17 + 1;
            }
            else {
              if ((~uVar9 & 0xe000) == 0) {
                lVar6 = lVar6 + 3;
                goto LAB_00123120;
              }
              puVar18 = puVar17 + 1;
              lVar25 = -1;
              if (((uVar13 != 1) && ((uVar9 & 0xfc00) == 0xd800)) && ((*puVar18 & 0xfc00) == 0xdc00)
                 ) {
                lVar6 = lVar6 + 4;
                lVar25 = -2;
                puVar18 = puVar17 + 2;
              }
            }
            puVar17 = puVar18;
            uVar13 = uVar13 + lVar25;
          } while (uVar13 != 0);
          pbVar27 = (byte *)(lVar6 + 1);
        }
        pbVar14 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(pbVar27);
        bVar31 = pbVar14 != (byte *)0x0;
        if (pbVar14 == (byte *)0x0) {
LAB_00123753:
          pbVar14 = (byte *)0x0;
          size = 0;
          goto LAB_00123758;
        }
        pbVar28 = pbVar14;
        puVar17 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar9 = *puVar17;
            uVar15 = (uint)uVar9;
            if ((uVar9 < 0xd800) || ((~uVar9 & 0xe000) == 0)) {
              pbVar28 = utf8_writer::low(pbVar28,uVar15);
              puVar18 = puVar17 + 1;
              lVar6 = -1;
            }
            else {
              puVar18 = puVar17 + 1;
              lVar6 = -1;
              if ((uVar22 != 1) && ((uVar15 & 0xfc00) == 0xd800)) {
                uVar9 = *puVar18;
                if ((uVar9 & 0xfc00) == 0xdc00) {
                  uVar10 = (uVar15 << 10 & 0xffc00) + 0x10000;
                  *pbVar28 = (byte)(uVar10 >> 0x12) | 0xf0;
                  pbVar28[1] = (byte)(uVar10 >> 0xc) & 0x3f | 0x80;
                  pbVar28[2] = (byte)((uVar9 & 0x3c0 | uVar15 << 10) >> 6) & 0x3f | 0x80;
                  pbVar28[3] = (byte)uVar9 & 0x3f | 0x80;
                  pbVar28 = pbVar28 + 4;
                  puVar18 = puVar17 + 2;
                  lVar6 = -2;
                }
              }
            }
            uVar22 = uVar22 + lVar6;
            puVar17 = puVar18;
          } while (uVar22 != 0);
        }
      }
      else {
        if (1 < size) {
          lVar6 = 0;
          uVar13 = uVar22;
          puVar17 = (ushort *)contents;
          do {
            uVar9 = *puVar17 << 8;
            uVar24 = uVar9 | *puVar17 >> 8;
            if (uVar24 < 0xd800) {
              lVar25 = 3 - (ulong)(uVar24 < 0x800);
              if (uVar24 < 0x80) {
                lVar25 = 1;
              }
              lVar6 = lVar6 + lVar25;
LAB_0012330b:
              lVar25 = -1;
              puVar18 = puVar17 + 1;
            }
            else {
              if ((~uVar24 & 0xe000) == 0) {
                lVar6 = lVar6 + 3;
                goto LAB_0012330b;
              }
              puVar18 = puVar17 + 1;
              lVar25 = -1;
              if (((uVar13 != 1) && ((uVar9 & 0xfc00) == 0xd800)) && ((*puVar18 & 0xfc) == 0xdc)) {
                lVar6 = lVar6 + 4;
                lVar25 = -2;
                puVar18 = puVar17 + 2;
              }
            }
            puVar17 = puVar18;
            uVar13 = uVar13 + lVar25;
          } while (uVar13 != 0);
          pbVar27 = (byte *)(lVar6 + 1);
        }
        pbVar14 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(pbVar27);
        bVar31 = pbVar14 != (byte *)0x0;
        if (pbVar14 == (byte *)0x0) goto LAB_00123753;
        pbVar28 = pbVar14;
        puVar17 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar9 = *puVar17 << 8 | *puVar17 >> 8;
            uVar15 = (uint)uVar9;
            if ((uVar9 < 0xd800) || ((~uVar9 & 0xe000) == 0)) {
              pbVar28 = utf8_writer::low(pbVar28,uVar15);
              puVar18 = puVar17 + 1;
              lVar6 = -1;
            }
            else {
              puVar18 = puVar17 + 1;
              lVar6 = -1;
              if ((uVar22 != 1) && ((uVar15 & 0xfc00) == 0xd800)) {
                uVar9 = *puVar18;
                uVar10 = (uint)(ushort)(uVar9 << 8 | uVar9 >> 8);
                if ((uVar10 & 0xfc00) == 0xdc00) {
                  uVar11 = (uVar15 << 10 & 0xffc00) + 0x10000;
                  *pbVar28 = (byte)(uVar11 >> 0x12) | 0xf0;
                  pbVar28[1] = (byte)(uVar11 >> 0xc) & 0x3f | 0x80;
                  pbVar28[2] = (byte)((uVar10 & 0x3c0 | uVar15 << 10) >> 6) & 0x3f | 0x80;
                  pbVar28[3] = (byte)(uVar9 >> 8) & 0x3f | 0x80;
                  pbVar28 = pbVar28 + 4;
                  puVar18 = puVar17 + 2;
                  lVar6 = -2;
                }
              }
            }
            uVar22 = uVar22 + lVar6;
            puVar17 = puVar18;
          } while (uVar22 != 0);
        }
      }
    }
    else if (xVar4 - encoding_utf32_le < 2) {
      uVar22 = size >> 2;
      pbVar27 = (byte *)0x1;
      if (xVar4 == encoding_utf32_le) {
        if (3 < size) {
          uVar13 = 0;
          lVar6 = 0;
          do {
            uVar15 = *(uint *)((long)contents + uVar13 * 4);
            lVar25 = 4;
            if ((uVar15 < 0x10000) && (lVar25 = 1, 0x7f < uVar15)) {
              lVar25 = 3 - (ulong)(uVar15 < 0x800);
            }
            lVar6 = lVar6 + lVar25;
            uVar13 = uVar13 + 1;
          } while (uVar22 != uVar13);
          pbVar27 = (byte *)(lVar6 + 1);
        }
        pbVar14 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(pbVar27);
        bVar31 = pbVar14 != (byte *)0x0;
        if (pbVar14 == (byte *)0x0) goto LAB_00123753;
        pbVar28 = pbVar14;
        if (3 < size) {
          uVar13 = 0;
          do {
            uVar15 = *(uint *)((long)contents + uVar13 * 4);
            if (uVar15 < 0x10000) {
              pbVar28 = utf8_writer::low(pbVar28,uVar15);
            }
            else {
              *pbVar28 = (byte)(uVar15 >> 0x12) | 0xf0;
              pbVar28[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
              pbVar28[2] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
              pbVar28[3] = (byte)uVar15 & 0x3f | 0x80;
              pbVar28 = pbVar28 + 4;
            }
            uVar13 = uVar13 + 1;
          } while (uVar22 != uVar13);
        }
      }
      else {
        if (3 < size) {
          uVar13 = 0;
          lVar6 = 0;
          do {
            uVar15 = *(uint *)((long)contents + uVar13 * 4);
            uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18;
            lVar25 = 4;
            if ((uVar15 < 0x10000) && (lVar25 = 1, 0x7f < uVar15)) {
              lVar25 = 3 - (ulong)(uVar15 < 0x800);
            }
            lVar6 = lVar6 + lVar25;
            uVar13 = uVar13 + 1;
          } while (uVar22 != uVar13);
          pbVar27 = (byte *)(lVar6 + 1);
        }
        pbVar14 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(pbVar27);
        bVar31 = pbVar14 != (byte *)0x0;
        if (pbVar14 == (byte *)0x0) goto LAB_00123753;
        pbVar28 = pbVar14;
        if (3 < size) {
          uVar13 = 0;
          do {
            uVar15 = *(uint *)((long)contents + uVar13 * 4);
            uVar10 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18;
            if (uVar10 < 0x10000) {
              pbVar28 = utf8_writer::low(pbVar28,uVar10);
            }
            else {
              *pbVar28 = (byte)(uVar10 >> 0x12) | 0xf0;
              pbVar28[1] = (byte)(uVar10 >> 0xc) & 0x3f | 0x80;
              pbVar28[2] = (byte)(uVar10 >> 6) & 0x3f | 0x80;
              pbVar28[3] = (byte)(uVar15 >> 0x18) & 0x3f | 0x80;
              pbVar28 = pbVar28 + 4;
            }
            uVar13 = uVar13 + 1;
          } while (uVar22 != uVar13);
        }
      }
    }
    else {
      pbVar14 = (byte *)0x0;
      if (xVar4 != encoding_latin1) {
        size = 0;
        bVar31 = false;
        goto LAB_0012375d;
      }
      pbVar26 = pbVar14;
      if (size != 0) {
        do {
          pbVar26 = pbVar14;
          if ((char)*(byte *)((long)contents + (long)pbVar14) < '\0') break;
          pbVar14 = pbVar14 + 1;
          pbVar26 = (byte *)size;
        } while ((byte *)size != pbVar14);
      }
      if (size <= pbVar26) {
        if (!is_mutable) {
          pbVar14 = (byte *)(*(code *)(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)
                                      (size + 1);
          goto LAB_00123190;
        }
        goto LAB_00123099;
      }
      local_78 = size - (long)pbVar26;
      if (local_78 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        pbVar14 = pbVar26;
        do {
          lVar6 = lVar6 + (ulong)(*(byte *)((long)contents + (long)pbVar14) >> 7) + 1;
          pbVar14 = pbVar14 + 1;
        } while ((byte *)size != pbVar14);
      }
      pbVar27 = pbVar26 + lVar6 + 1;
      local_80 = (byte *)size;
      pbVar14 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pbVar27);
      bVar31 = pbVar14 != (byte *)0x0;
      if (!bVar31) goto LAB_00123753;
      memcpy(pbVar14,contents,(size_t)pbVar26);
      pbVar29 = local_80;
      pbVar28 = pbVar14 + (long)pbVar26;
      if (local_78 != 0) {
        do {
          pbVar28 = utf8_writer::low(pbVar28,(uint)*(byte *)((long)contents + (long)pbVar26));
          pbVar26 = pbVar26 + 1;
        } while (pbVar29 != pbVar26);
      }
    }
LAB_0012374c:
    *pbVar28 = 0;
    bVar31 = true;
    size = (size_t)pbVar27;
LAB_00123758:
    xVar4 = (xml_encoding)local_a0;
  }
LAB_0012375d:
  if (!bVar31) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_out_of_memory;
    goto LAB_00124663;
  }
  if (own) {
    if ((contents != (void *)0x0) && (pbVar14 != (byte *)contents)) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
    if (pbVar14 != (byte *)contents || own) {
LAB_001237c3:
      *out_buffer = (char_t *)pbVar14;
    }
  }
  else if (pbVar14 != (byte *)contents) goto LAB_001237c3;
  doc->buffer = (char_t *)pbVar14;
  if ((byte *)size != (byte *)0x0) {
    if (local_70->first_child == (xml_node_struct *)0x0) {
      local_60 = (xml_node_struct *)0x0;
    }
    else {
      local_60 = local_70->first_child->prev_sibling_c;
    }
    local_b8.alloc = &doc->super_xml_allocator;
    if (doc == (xml_document_struct *)0x0) {
      local_b8.alloc = (xml_allocator *)0x0;
    }
    local_b8.error_offset = (char_t *)0x0;
    local_b8.error_status = status_ok;
    endch = (pbVar14 + -1)[size];
    (pbVar14 + -1)[size] = 0;
    local_90 = pbVar14;
    if ((*pbVar14 == 0xef) && (pbVar14[1] == 0xbb)) {
      local_90 = pbVar14 + (ulong)(pbVar14[2] == 0xbf) * 3;
    }
    local_48 = &local_70->first_child;
    local_80 = (byte *)(size + -1);
    local_38 = *(code **)((long)&PTR_parse_simple_00141c50 + (ulong)(options >> 1 & 0x78));
    local_40 = (code *)(&PTR_parse_00141cd0)[options >> 9 & 4 | options >> 4 & 3];
    local_78 = CONCAT71(local_78._1_7_,(options >> 0xb & 1) == 0 && (options & 0x408) != 0);
    local_64 = options & 0x22;
    local_d0 = local_70;
    pbVar26 = local_90;
LAB_001238fc:
    do {
      pbVar27 = pbVar26;
      if (*pbVar27 == 0) goto LAB_001245d0;
      if (*pbVar27 == 0x3c) {
        pbVar27 = pbVar27 + 1;
        goto LAB_00123a86;
      }
      pbVar26 = pbVar27 + -1;
      do {
        pbVar29 = pbVar26;
        bVar3 = pbVar29[1];
        pbVar26 = pbVar29 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
    } while (((bVar3 == 0x3c) || (bVar3 == 0)) &&
            (((char)local_78 == '\0' ||
             (((options >> 10 & 1) != 0 &&
              (((bVar3 != 0x3c || (pbVar29[2] != 0x2f)) ||
               (local_d0->first_child != (xml_node_struct *)0x0))))))));
    if ((options >> 0xb & 1) == 0) {
      pbVar26 = pbVar27;
    }
    if (((options >> 0xc & 1) == 0) &&
       (pbVar27 = pbVar26, local_d0->parent == (xml_node_struct *)0x0)) {
      do {
        bVar3 = *pbVar27;
        if (bVar3 == 0) goto LAB_001245d0;
        pbVar27 = pbVar27 + 1;
      } while (bVar3 != 0x3c);
    }
    else {
      pbVar27 = (byte *)(*local_40)(pbVar26);
      pbVar29 = local_90;
      if ((((options >> 0xd & 1) == 0) ||
          ((local_d0->parent == (xml_node_struct *)0x0 ||
           (local_d0->first_child != (xml_node_struct *)0x0)))) ||
         (local_d0->value != (char_t *)0x0)) {
        if ((((options >> 0xe & 1) != 0) && (local_d0->first_child != (xml_node_struct *)0x0)) &&
           ((local_d0->first_child->prev_sibling_c->header & 0xf) == 3)) {
          sVar5 = strlen((char *)local_90);
          local_90 = (byte *)strlen((char *)pbVar26);
          memmove(pbVar29 + sVar5,pbVar26,(long)local_90 + 1);
          local_90 = pbVar29 + sVar5 + (long)local_90;
          goto LAB_00123a6c;
        }
        pxVar8 = append_new_node(local_d0,local_b8.alloc,node_pcdata);
        if (pxVar8 != (xml_node_struct *)0x0) {
          pxVar8->value = (char_t *)pbVar26;
          local_90 = pbVar26;
          goto LAB_00123a6c;
        }
        local_b8.error_status = status_out_of_memory;
        cVar2 = '\x01';
        local_d0 = (xml_node_struct *)0x0;
        local_b8.error_offset = (char_t *)pbVar27;
      }
      else {
        local_d0->value = (char_t *)pbVar26;
LAB_00123a6c:
        cVar2 = (*pbVar27 == 0) * '\x03';
      }
      if (cVar2 != '\0') {
        if (cVar2 == '\x03') {
LAB_001245d0:
          if (local_d0 != local_70) {
            local_b8.error_status = status_end_element_mismatch;
            local_b8.error_offset = (char_t *)pbVar27;
          }
        }
        goto LAB_001245e5;
      }
    }
LAB_00123a86:
    bVar3 = *pbVar27;
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar3]) {
      if (bVar3 == 0x21) {
        bVar3 = pbVar27[1];
        if (bVar3 == 0x5b) {
          if (pbVar27[2] == 0x43) {
            if (pbVar27[3] == 0x44) {
              if (pbVar27[4] == 0x41) {
                if (pbVar27[5] == 0x54) {
                  if (pbVar27[6] == 0x41) {
                    if (pbVar27[7] == 0x5b) {
                      pbVar26 = pbVar27 + 8;
                      if ((options & 4) == 0) {
                        do {
                          if (*pbVar26 == 0x5d) {
                            if (pbVar26[1] == 0x5d) {
                              if ((pbVar26[2] == 0x3e) || (endch == 0x3e && pbVar26[2] == 0))
                              goto LAB_00124587;
                            }
                          }
                          else if (*pbVar26 == 0) goto LAB_0012445a;
                          pbVar26 = pbVar26 + 1;
                        } while( true );
                      }
                      pxVar8 = append_new_node(local_d0,local_b8.alloc,node_cdata);
                      if (pxVar8 == (xml_node_struct *)0x0) goto LAB_001244fe;
                      pxVar8->value = (char_t *)pbVar26;
                      if ((options & 0x20) == 0) {
LAB_001244c0:
                        if (*pbVar26 == 0x5d) {
                          if (pbVar26[1] != 0x5d) goto LAB_001244f4;
                          if ((pbVar26[2] != 0x3e) && (endch != 0x3e || pbVar26[2] != 0))
                          goto LAB_001244f4;
                          *pbVar26 = 0;
LAB_00124587:
                          pbVar26 = pbVar26 + 1;
                          goto LAB_0012458a;
                        }
                        if (*pbVar26 != 0) goto LAB_001244f4;
                        goto LAB_0012445a;
                      }
                      pbVar26 = (byte *)strconv_cdata((char_t *)pbVar26,endch);
                      if (pbVar26 != (byte *)0x0) {
LAB_0012458a:
                        pbVar26 = pbVar26 + (ulong)(pbVar26[1] == 0x3e) + 1;
                        goto LAB_00124465;
                      }
                      pbVar26 = (byte *)pxVar8->value;
                    }
                    else {
                      pbVar26 = pbVar27 + 7;
                    }
                  }
                  else {
                    pbVar26 = pbVar27 + 6;
                  }
                }
                else {
                  pbVar26 = pbVar27 + 5;
                }
              }
              else {
                pbVar26 = pbVar27 + 4;
              }
            }
            else {
              pbVar26 = pbVar27 + 3;
            }
          }
          else {
            pbVar26 = pbVar27 + 2;
          }
LAB_0012445a:
          local_b8.error_offset = (char_t *)pbVar26;
          local_b8.error_status = status_bad_cdata;
          goto LAB_00124462;
        }
        if (bVar3 != 0x44) {
          if (bVar3 != 0x2d) goto LAB_00123e65;
          if (pbVar27[2] == 0x2d) {
            pbVar26 = pbVar27 + 3;
            pxVar8 = local_d0;
            if ((options & 2) == 0) {
LAB_00123c47:
              if (local_64 != 0x22) {
                do {
                  if (*pbVar26 == 0x2d) {
                    if (pbVar26[1] == 0x2d) {
                      if ((pbVar26[2] == 0x3e) || (endch == 0x3e && pbVar26[2] == 0)) {
                        if ((options & 2) != 0) {
                          *pbVar26 = 0;
                        }
                        pbVar26 = pbVar26 + (ulong)(pbVar26[2] == 0x3e) + 2;
                        goto LAB_00124465;
                      }
                    }
                  }
                  else if (*pbVar26 == 0) goto LAB_00123f91;
                  pbVar26 = pbVar26 + 1;
                } while( true );
              }
              pbVar27 = (byte *)0x0;
              lVar6 = 0;
LAB_00123c5a:
              do {
                pbVar29 = pbVar26;
                if (((anonymous_namespace)::chartype_table[*pbVar29] & 0x20) == 0) {
                  if (((anonymous_namespace)::chartype_table[pbVar29[1]] & 0x20) != 0) {
                    pbVar29 = pbVar29 + 1;
                    goto LAB_00123ca5;
                  }
                  if (((anonymous_namespace)::chartype_table[pbVar29[2]] & 0x20) != 0) {
                    pbVar29 = pbVar29 + 2;
                    goto LAB_00123ca5;
                  }
                  bVar31 = ((anonymous_namespace)::chartype_table[pbVar29[3]] & 0x20) == 0;
                  if (bVar31) {
                    pbVar29 = pbVar29 + 4;
                  }
                  else {
                    pbVar29 = pbVar29 + 3;
                  }
                }
                else {
LAB_00123ca5:
                  bVar31 = false;
                }
                pbVar26 = pbVar29;
              } while (bVar31);
              bVar3 = *pbVar29;
              if (bVar3 == 0xd) {
                *pbVar29 = 10;
                pbVar26 = pbVar29 + 1;
                if (pbVar29[1] == 10) {
                  if (pbVar27 != (byte *)0x0) {
                    memmove(pbVar27 + -lVar6,pbVar27,(long)(pbVar29 + 1) - (long)pbVar27);
                  }
                  pbVar27 = pbVar29 + 2;
                  lVar6 = lVar6 + 1;
                  pbVar26 = pbVar27;
                }
                goto LAB_00123c5a;
              }
              if (bVar3 == 0x2d) {
                if ((pbVar29[1] == 0x2d) &&
                   ((pbVar29[2] == 0x3e || (endch == 0x3e && pbVar29[2] == 0)))) {
                  if (pbVar27 != (byte *)0x0) {
                    memmove(pbVar27 + -lVar6,pbVar27,(long)pbVar29 - (long)pbVar27);
                    pbVar26 = pbVar29 + -lVar6;
                  }
                  *pbVar26 = 0;
                  pbVar26 = pbVar29 + (ulong)(pbVar29[2] == 0x3e) + 2;
                  goto LAB_00124268;
                }
              }
              else if (bVar3 == 0) goto LAB_00124265;
              pbVar26 = pbVar29 + 1;
              goto LAB_00123c5a;
            }
            pxVar8 = append_new_node(local_d0,local_b8.alloc,node_comment);
            if (pxVar8 != (xml_node_struct *)0x0) {
              pxVar8->value = (char_t *)pbVar26;
              goto LAB_00123c47;
            }
LAB_001244fe:
            local_b8.error_offset = (char_t *)pbVar26;
            local_b8.error_status = status_out_of_memory;
            goto LAB_00124462;
          }
          pbVar26 = pbVar27 + 2;
          goto LAB_00123f91;
        }
        if ((((pbVar27[2] != 0x4f) || (pbVar27[3] != 0x43)) || (pbVar27[4] != 0x54)) ||
           ((pbVar27[5] != 0x59 || (pbVar27[6] != 0x50)))) {
LAB_00123e65:
          pbVar26 = pbVar27 + 1;
          if ((endch != 0x2d) || (bVar3 != 0)) {
            if ((endch == 0x5b) && (bVar3 == 0)) goto LAB_0012445a;
            local_b8.error_status = status_unrecognized_tag;
            local_b8.error_offset = (char_t *)pbVar26;
            goto LAB_00124462;
          }
          goto LAB_00123f91;
        }
        if ((pbVar27[7] != 0x45) && (endch != 0x45 || pbVar27[7] != 0)) goto LAB_00123e65;
        if (local_d0->parent != (xml_node_struct *)0x0) {
          local_b8.error_status = status_bad_doctype;
          local_b8.error_offset = (char_t *)(pbVar27 + -1);
          goto LAB_00124462;
        }
        pbVar26 = (byte *)xml_parser::parse_doctype_group(&local_b8,(char_t *)(pbVar27 + -1),endch);
        if (pbVar26 == (byte *)0x0) goto LAB_00124462;
        if (*pbVar26 != 0) {
          *pbVar26 = 0;
          pbVar26 = pbVar26 + 1;
        }
        if ((options >> 9 & 1) != 0) {
          pbVar27 = pbVar27 + 7;
          do {
            pbVar29 = pbVar27 + 1;
            pbVar27 = pbVar27 + 1;
          } while (((anonymous_namespace)::chartype_table[*pbVar29] & 8) != 0);
          pxVar8 = append_new_node(local_d0,local_b8.alloc,node_doctype);
          if (pxVar8 == (xml_node_struct *)0x0) goto LAB_001244fe;
          pxVar8->value = (char_t *)pbVar27;
        }
        goto LAB_00124465;
      }
      if (bVar3 == 0x3f) {
        pbVar26 = pbVar27 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar27[1]]) goto LAB_00123be1;
        lVar6 = 4;
        pbVar29 = pbVar27 + 3;
        pbVar28 = pbVar26;
        do {
          pbVar23 = pbVar28;
          pbVar19 = pbVar29;
          pbVar28 = pbVar23 + 1;
          lVar6 = lVar6 + -1;
          pbVar29 = pbVar19 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar23] & 0x40) != 0);
        local_98 = __return_storage_ptr__;
        if (*pbVar23 == 0) {
LAB_00123f65:
          local_b8.error_status = status_bad_pi;
LAB_00123f72:
          pbVar26 = (byte *)0x0;
          __return_storage_ptr__ = local_98;
          local_b8.error_offset = (char_t *)pbVar23;
        }
        else {
          if (((pbVar27[1] & 0xdf) == 0x58) && ((pbVar27[2] & 0xdf) == 0x4d)) {
            uVar16 = (undefined4)
                     CONCAT71((int7)((ulong)pbVar29 >> 8),lVar6 == 0 && (pbVar27[3] & 0xdf) == 0x4c)
            ;
          }
          else {
            uVar16 = 0;
          }
          uVar15 = 1;
          if ((char)uVar16 != '\0') {
            uVar15 = 0x100;
          }
          if ((options & uVar15) == 0) {
            do {
              if (*pbVar23 == 0x3f) {
                bVar3 = pbVar23[1];
                if ((bVar3 == 0x3e) || (endch == 0x3e && bVar3 == 0)) {
                  pbVar26 = pbVar23 + (ulong)(bVar3 == 0x3e) + 1;
                  goto LAB_001240b8;
                }
              }
              else if (*pbVar23 == 0) goto LAB_001240a3;
              pbVar23 = pbVar23 + 1;
            } while( true );
          }
          if ((char)uVar16 == '\0') {
            local_84 = uVar16;
            pxVar8 = append_new_node(local_d0,local_b8.alloc,node_pi);
            __return_storage_ptr__ = local_98;
          }
          else {
            if (local_d0->parent != (xml_node_struct *)0x0) goto LAB_00123f65;
            local_84 = uVar16;
            local_50 = pbVar26;
            pxVar8 = append_new_node(local_d0,local_b8.alloc,node_declaration);
            __return_storage_ptr__ = local_98;
            pbVar26 = local_50;
          }
          local_98 = __return_storage_ptr__;
          if (pxVar8 == (xml_node_struct *)0x0) {
            local_b8.error_status = status_out_of_memory;
            goto LAB_00123f72;
          }
          pxVar8->name = (char_t *)pbVar26;
          bVar3 = *pbVar23;
          *pbVar23 = 0;
          if ((ulong)bVar3 == 0x3f) {
            bVar3 = *pbVar28;
            if ((bVar3 != 0x3e) && (pbVar26 = pbVar28, endch != 0x3e || bVar3 != 0))
            goto LAB_00123be1;
            pbVar26 = pbVar28 + (bVar3 == 0x3e);
            local_d0 = pxVar8->parent;
          }
          else {
            pbVar26 = pbVar23;
            if (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0) {
              do {
                pbVar29 = pbVar19;
                pbVar27 = pbVar26 + 1;
                pbVar26 = pbVar26 + 1;
                pbVar19 = pbVar29 + 1;
              } while (((anonymous_namespace)::chartype_table[*pbVar27] & 8) != 0);
              do {
                if (pbVar29[-1] == 0x3f) {
                  if ((*pbVar29 == 0x3e) || (endch == 0x3e && *pbVar29 == 0)) {
                    if ((char)local_84 == '\0') {
                      pxVar8->value = (char_t *)pbVar26;
                      local_d0 = pxVar8->parent;
                      pbVar29[-1] = 0;
                      pbVar26 = pbVar29 + (*pbVar29 == 0x3e);
                    }
                    else {
                      pbVar29[-1] = 0x2f;
                      local_d0 = pxVar8;
                    }
                    goto LAB_001240b8;
                  }
                }
                else if (pbVar29[-1] == 0) goto LAB_00124426;
                pbVar29 = pbVar29 + 1;
              } while( true );
            }
            local_b8.error_status = status_bad_pi;
            pbVar26 = (byte *)0x0;
            local_b8.error_offset = (char_t *)pbVar28;
          }
        }
        goto LAB_001240b8;
      }
      if (bVar3 != 0x2f) {
        local_b8.error_status = (endch == 0x3f && bVar3 == 0) + status_unrecognized_tag;
        local_b8.error_offset = (char_t *)pbVar27;
        goto LAB_001245e5;
      }
      pbVar27 = pbVar27 + 1;
      pbVar29 = (byte *)local_d0->name;
      xVar12 = status_end_element_mismatch;
      pbVar28 = pbVar27;
      pbVar26 = pbVar27;
      xVar21 = status_end_element_mismatch;
      if (pbVar29 != (byte *)0x0) {
LAB_00123ac8:
        bVar3 = *pbVar26;
        xVar21 = xVar12;
        if (((anonymous_namespace)::chartype_table[bVar3] & 0x40) != 0) goto code_r0x00123ad6;
        if (*pbVar29 == 0) {
          local_d0 = local_d0->parent;
          do {
            pbVar28 = pbVar26;
            bVar3 = *pbVar28;
            pbVar26 = pbVar28 + 1;
          } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
          pbVar27 = pbVar28;
          if (bVar3 != 0) {
            if (bVar3 == 0x3e) {
              bVar31 = true;
              goto LAB_001242a8;
            }
            xVar21 = status_bad_end_element;
            goto LAB_0012429a;
          }
          bVar31 = true;
          pbVar26 = pbVar28;
          xVar21 = status_bad_end_element;
          if (endch != 0x3e) goto LAB_0012429a;
          goto LAB_001242a8;
        }
        pbVar28 = pbVar26;
        if (((bVar3 == 0) && (*pbVar29 == endch)) && (pbVar29[1] == 0)) {
          pbVar27 = pbVar26;
          xVar21 = status_bad_end_element;
        }
      }
LAB_0012429a:
      local_b8.error_status = xVar21;
      bVar31 = false;
      pbVar26 = pbVar28;
      local_b8.error_offset = (char_t *)pbVar27;
LAB_001242a8:
      if (!bVar31) goto LAB_001245e5;
      goto LAB_001238fc;
    }
    local_d0 = append_new_node(local_d0,local_b8.alloc,node_element);
    if (local_d0 == (xml_node_struct *)0x0) {
      local_b8.error_status = status_out_of_memory;
      local_b8.error_offset = (char_t *)pbVar27;
      goto LAB_001245e5;
    }
    local_d0->name = (char_t *)pbVar27;
    do {
      if (((anonymous_namespace)::chartype_table[*pbVar27] & 0x40) == 0) {
LAB_00123b5b:
        bVar3 = 0;
      }
      else {
        if (((anonymous_namespace)::chartype_table[pbVar27[1]] & 0x40) == 0) {
          pbVar27 = pbVar27 + 1;
          goto LAB_00123b5b;
        }
        if (((anonymous_namespace)::chartype_table[pbVar27[2]] & 0x40) == 0) {
          pbVar27 = pbVar27 + 2;
          goto LAB_00123b5b;
        }
        bVar3 = ((anonymous_namespace)::chartype_table[pbVar27[3]] & 0x40) >> 6;
        if (bVar3 == 0) {
          pbVar27 = pbVar27 + 3;
        }
        else {
          pbVar27 = pbVar27 + 4;
        }
      }
    } while (bVar3 != 0);
    bVar3 = *pbVar27;
    uVar22 = (ulong)bVar3;
    pbVar26 = pbVar27 + 1;
    *pbVar27 = 0;
    if (uVar22 == 0x3e) goto LAB_001238fc;
    if (((anonymous_namespace)::chartype_table[uVar22] & 8) != 0) goto LAB_001240d4;
    if (uVar22 == 0) {
      pbVar26 = pbVar27;
      if (endch == 0x3e) goto LAB_001238fc;
    }
    else {
      pbVar27 = pbVar26;
      if (bVar3 != 0x2f) goto LAB_0012472c;
      bVar3 = *pbVar26;
      if ((bVar3 == 0x3e) || (endch == 0x3e && bVar3 == 0)) {
        local_d0 = local_d0->parent;
        pbVar26 = pbVar26 + (bVar3 == 0x3e);
        goto LAB_001238fc;
      }
    }
    goto LAB_0012472c;
  }
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
LAB_0012465c:
  __return_storage_ptr__->encoding = xVar4;
  pvVar30 = (void *)0x0;
LAB_00124663:
  if (pvVar30 != (void *)0x0) {
    (*local_58)(pvVar30);
  }
  return __return_storage_ptr__;
LAB_001244f4:
  pbVar26 = pbVar26 + 1;
  goto LAB_001244c0;
LAB_00124265:
  pbVar26 = (byte *)0x0;
LAB_00124268:
  if (pbVar26 == (byte *)0x0) {
    pbVar26 = (byte *)pxVar8->value;
LAB_00123f91:
    local_b8.error_offset = (char_t *)pbVar26;
    local_b8.error_status = status_bad_comment;
LAB_00124462:
    pbVar26 = (byte *)0x0;
  }
LAB_00124465:
  if (pbVar26 == (byte *)0x0) goto LAB_001245e5;
  goto LAB_001238fc;
LAB_001240a3:
  local_b8.error_status = status_bad_pi;
  pbVar26 = (byte *)0x0;
  local_b8.error_offset = (char_t *)pbVar23;
  goto LAB_001240b8;
LAB_00124426:
  pbVar26 = pbVar29 + -1;
LAB_00123be1:
  local_b8.error_offset = (char_t *)pbVar26;
  local_b8.error_status = status_bad_pi;
  pbVar26 = (byte *)0x0;
LAB_001240b8:
  if (pbVar26 == (byte *)0x0) goto LAB_001245e5;
  if ((local_d0->header & 0xf) != 7) goto LAB_001238fc;
LAB_001240d4:
  while( true ) {
    do {
      pbVar27 = pbVar26;
      bVar3 = *pbVar27;
      pbVar26 = pbVar27 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar3]) break;
    pxVar7 = append_new_attribute(local_d0,local_b8.alloc);
    if (pxVar7 == (xml_attribute_struct *)0x0) {
      pbVar26 = pbVar27;
      xVar21 = status_out_of_memory;
LAB_001241d2:
      bVar31 = false;
      local_b8.error_offset = (char_t *)pbVar26;
      local_b8.error_status = xVar21;
    }
    else {
      pxVar7->name = (char_t *)pbVar27;
      do {
        if (((anonymous_namespace)::chartype_table[*pbVar27] & 0x40) == 0) {
LAB_0012415c:
          bVar3 = 0;
        }
        else {
          if (((anonymous_namespace)::chartype_table[pbVar27[1]] & 0x40) == 0) {
            pbVar27 = pbVar27 + 1;
            goto LAB_0012415c;
          }
          if (((anonymous_namespace)::chartype_table[pbVar27[2]] & 0x40) == 0) {
            pbVar27 = pbVar27 + 2;
            goto LAB_0012415c;
          }
          bVar3 = ((anonymous_namespace)::chartype_table[pbVar27[3]] & 0x40) >> 6;
          if (bVar3 == 0) {
            pbVar27 = pbVar27 + 3;
          }
          else {
            pbVar27 = pbVar27 + 4;
          }
        }
      } while (bVar3 != 0);
      bVar3 = *pbVar27;
      *pbVar27 = 0;
      while (pbVar27 = pbVar27 + 1, ((anonymous_namespace)::chartype_table[bVar3] & 8) != 0) {
        bVar3 = *pbVar27;
      }
      pbVar26 = pbVar27;
      pbVar29 = pbVar27;
      xVar21 = status_bad_attribute;
      if (bVar3 != 0x3d) goto LAB_001241d2;
      do {
        pbVar27 = pbVar29;
        bVar3 = *pbVar27;
        pbVar29 = pbVar27 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
      if ((bVar3 != 0x22) && (pbVar26 = pbVar27, bVar3 != 0x27)) goto LAB_001241d2;
      pxVar7->value = (char_t *)pbVar29;
      pbVar27 = (byte *)(*local_38)(pbVar29);
      xVar21 = status_bad_attribute;
      if (pbVar27 == (byte *)0x0) {
        pbVar27 = (byte *)0x0;
        pbVar26 = (byte *)pxVar7->value;
        goto LAB_001241d2;
      }
      bVar31 = true;
      pbVar26 = pbVar27;
      if ((char)(anonymous_namespace)::chartype_table[*pbVar27] < '\0') goto LAB_001241d2;
    }
    pbVar26 = pbVar27;
    if (!bVar31) goto LAB_001245e5;
  }
  if (bVar3 == 0x3e) goto LAB_001238fc;
  if (bVar3 == 0x2f) {
    if (*pbVar26 == 0x3e) {
      local_d0 = local_d0->parent;
      pbVar26 = pbVar27 + 2;
      goto LAB_001238fc;
    }
    pbVar27 = pbVar26;
    if ((endch == 0x3e) && (*pbVar26 == 0)) {
      local_d0 = local_d0->parent;
      goto LAB_001238fc;
    }
  }
  else if ((endch == 0x3e) && (pbVar26 = pbVar27, bVar3 == 0)) goto LAB_001238fc;
LAB_0012472c:
  local_b8.error_offset = (char_t *)pbVar27;
  local_b8.error_status = status_bad_start_element;
  goto LAB_001245e5;
code_r0x00123ad6:
  bVar1 = *pbVar29;
  pbVar28 = pbVar26 + 1;
  pbVar26 = pbVar26 + 1;
  pbVar29 = pbVar29 + 1;
  if (bVar3 != bVar1) goto LAB_0012429a;
  goto LAB_00123ac8;
LAB_001245e5:
  pbVar14 = (byte *)(local_b8.error_offset + -(long)pbVar14);
  if ((byte *)local_b8.error_offset == (byte *)0x0) {
    pbVar14 = (byte *)0x0;
  }
  xVar4 = (xml_encoding)local_a0;
  if (local_b8.error_status == status_ok) {
    if (endch == 0x3c) {
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_unrecognized_tag;
LAB_00124658:
      __return_storage_ptr__->offset = (ptrdiff_t)local_80;
      goto LAB_0012465c;
    }
    if ((options >> 0xc & 1) == 0) {
      ppxVar20 = &local_60->next_sibling;
      if (local_60 == (xml_node_struct *)0x0) {
        ppxVar20 = local_48;
      }
      for (pxVar8 = *ppxVar20; pxVar8 != (xml_node_struct *)0x0; pxVar8 = pxVar8->next_sibling) {
        if ((pxVar8->header & 0xf) == 2) goto LAB_00124627;
      }
      if (pxVar8 == (xml_node_struct *)0x0) {
        __return_storage_ptr__->encoding = encoding_auto;
        __return_storage_ptr__->status = status_no_document_element;
        goto LAB_00124658;
      }
    }
  }
  else if (0 < (long)pbVar14) {
    pbVar14 = pbVar14 + -(ulong)(endch == 0 && pbVar14 == local_80);
  }
LAB_00124627:
  __return_storage_ptr__->status = local_b8.error_status;
  __return_storage_ptr__->offset = (ptrdiff_t)pbVar14;
  __return_storage_ptr__->encoding = encoding_auto;
  goto LAB_0012465c;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}